

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O2

Interval * tcu::applyMonotone(Interval *__return_storage_ptr__,DoubleFunc1 *func,Interval *arg0)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ScopedRoundingMode point_ctx_;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar10 = arg0->m_lo;
  if (dVar10 < arg0->m_hi || dVar10 == arg0->m_hi) {
    point_ctx_.m_oldMode = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar4 = (*func)(dVar10);
    dVar5 = dVar4;
    if (NAN(dVar4)) {
      dVar5 = INFINITY;
    }
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar6 = (*func)(dVar10);
    dVar10 = dVar6;
    if (NAN(dVar6)) {
      dVar10 = INFINITY;
    }
    ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
    dVar11 = arg0->m_hi;
    point_ctx_.m_oldMode = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar7 = (*func)(dVar11);
    dVar8 = dVar7;
    if (NAN(dVar7)) {
      dVar8 = INFINITY;
    }
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar9 = (*func)(dVar11);
    dVar11 = (double)(~-(ulong)NAN(dVar4) & (ulong)dVar4 | -(ulong)NAN(dVar4) & 0xfff0000000000000);
    dVar1 = (double)(~-(ulong)NAN(dVar6) & (ulong)dVar6 | -(ulong)NAN(dVar6) & 0xfff0000000000000);
    uVar3 = -(ulong)(dVar1 <= dVar11);
    dVar12 = (double)(-(ulong)(dVar5 <= dVar10) & (ulong)dVar5 |
                     ~-(ulong)(dVar5 <= dVar10) & (ulong)dVar10);
    dVar5 = (double)(uVar3 & (ulong)dVar11 | ~uVar3 & (ulong)dVar1);
    dVar10 = (double)(~-(ulong)NAN(dVar7) & (ulong)dVar7 | -(ulong)NAN(dVar7) & 0xfff0000000000000);
    dVar11 = dVar9;
    if (NAN(dVar9)) {
      dVar11 = INFINITY;
    }
    dVar1 = (double)(~-(ulong)NAN(dVar9) & (ulong)dVar9 | -(ulong)NAN(dVar9) & 0xfff0000000000000);
    dVar11 = (double)(-(ulong)(dVar8 <= dVar11) & (ulong)dVar8 |
                     ~-(ulong)(dVar8 <= dVar11) & (ulong)dVar11);
    uVar3 = -(ulong)(dVar1 <= dVar10);
    dVar10 = (double)(uVar3 & (ulong)dVar10 | ~uVar3 & (ulong)dVar1);
    ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
    bVar2 = (bool)((-(NAN(dVar4) || NAN(dVar6)) | -(NAN(dVar7) || NAN(dVar9))) & 1);
    uVar3 = -(ulong)(dVar12 <= dVar11);
    dVar4 = (double)(uVar3 & (ulong)dVar12 | ~uVar3 & (ulong)dVar11);
    uVar3 = -(ulong)(dVar10 <= dVar5);
    dVar10 = (double)(uVar3 & (ulong)dVar5 | ~uVar3 & (ulong)dVar10);
  }
  else {
    dVar10 = -INFINITY;
    dVar4 = INFINITY;
    bVar2 = false;
  }
  __return_storage_ptr__->m_hasNaN = bVar2;
  __return_storage_ptr__->m_lo = dVar4;
  __return_storage_ptr__->m_hi = dVar10;
  if (arg0->m_hasNaN == true) {
    point_ctx_.m_oldMode._0_1_ = 1;
    Interval::operator|=(__return_storage_ptr__,(Interval *)&point_ctx_);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval applyMonotone (DoubleFunc1& func, const Interval& arg0)
{
	Interval ret;
	TCU_INTERVAL_APPLY_MONOTONE1(ret, x, arg0, val,
								 TCU_SET_INTERVAL(val, point, point = func(x)));
	return ret;
}